

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-get-currentexe.c
# Opt level: O3

int run_test_get_currentexe(void)

{
  int iVar1;
  int iVar2;
  int extraout_EAX;
  char *__s1;
  char **ppcVar3;
  char **ppcVar4;
  undefined8 uVar5;
  size_t sVar6;
  uv_getaddrinfo_t *puVar7;
  undefined4 *puVar8;
  int *piVar9;
  long extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  long extraout_RDX_02;
  char *unaff_RBX;
  char *pcVar10;
  size_t *psVar11;
  undefined8 *puVar12;
  int *piVar13;
  long lVar14;
  size_t size;
  char buffer [1024];
  undefined1 auStack_6a0 [144];
  undefined8 uStack_610;
  char **ppcStack_600;
  char **ppcStack_5f8;
  char **ppcStack_5f0;
  undefined1 auStack_5e8 [144];
  undefined8 uStack_558;
  char **ppcStack_548;
  code *pcStack_540;
  undefined1 auStack_538 [160];
  char **ppcStack_498;
  char *pcStack_488;
  long lStack_480;
  long lStack_478;
  char *pcStack_470;
  char **ppcStack_468;
  char **ppcStack_460;
  undefined1 *puStack_450;
  double dStack_440;
  double dStack_438;
  double dStack_430;
  char *pcStack_420;
  char *local_410;
  char local_408;
  char local_407;
  
  local_410 = (char *)0x400;
  pcStack_420 = (char *)0x15b1aa;
  iVar1 = uv_exepath(&local_408);
  if (iVar1 == 0) {
    pcVar10 = executable_path;
    if ((executable_path[0] == '.') && (executable_path[1] == '/')) {
      pcVar10 = executable_path + 2;
    }
    pcStack_420 = (char *)0x15b1df;
    __s1 = strstr(&local_408,pcVar10);
    if (__s1 == (char *)0x0) {
LAB_0015b2f1:
      pcStack_420 = (char *)0x15b2f6;
      run_test_get_currentexe_cold_13();
      unaff_RBX = pcVar10;
      goto LAB_0015b2f6;
    }
    pcStack_420 = (char *)0x15b1f3;
    iVar1 = strcmp(__s1,pcVar10);
    unaff_RBX = local_410;
    if (iVar1 != 0) goto LAB_0015b2f1;
    pcStack_420 = (char *)0x15b20a;
    pcVar10 = (char *)strlen(&local_408);
    if (unaff_RBX != pcVar10) goto LAB_0015b2fb;
    local_410 = (char *)0x400;
    pcStack_420 = (char *)0x15b226;
    iVar1 = uv_exepath(0);
    if (iVar1 != -0x16) goto LAB_0015b300;
    pcStack_420 = (char *)0x15b23b;
    iVar1 = uv_exepath(&local_408,0);
    if (iVar1 != -0x16) goto LAB_0015b305;
    local_410 = (char *)0x0;
    pcStack_420 = (char *)0x15b25a;
    iVar1 = uv_exepath(&local_408);
    if (iVar1 != -0x16) goto LAB_0015b30a;
    unaff_RBX = &local_408;
    pcStack_420 = (char *)0x15b27a;
    memset(unaff_RBX,0xff,0x400);
    local_410 = (char *)0x1;
    pcStack_420 = (char *)0x15b28e;
    iVar1 = uv_exepath(unaff_RBX);
    if (iVar1 != 0) goto LAB_0015b30f;
    if (local_410 != (char *)0x0) goto LAB_0015b314;
    if (local_408 != '\0') goto LAB_0015b319;
    unaff_RBX = &local_408;
    pcStack_420 = (char *)0x15b2b8;
    memset(unaff_RBX,0xff,0x400);
    local_410 = (char *)0x2;
    pcStack_420 = (char *)0x15b2cc;
    iVar1 = uv_exepath(unaff_RBX);
    if (iVar1 != 0) goto LAB_0015b31e;
    if (local_410 != (char *)0x1) goto LAB_0015b323;
    if (local_408 == '\0') goto LAB_0015b328;
    if (local_407 == '\0') {
      return 0;
    }
  }
  else {
LAB_0015b2f6:
    pcStack_420 = (char *)0x15b2fb;
    run_test_get_currentexe_cold_1();
LAB_0015b2fb:
    pcStack_420 = (char *)0x15b300;
    run_test_get_currentexe_cold_2();
LAB_0015b300:
    pcStack_420 = (char *)0x15b305;
    run_test_get_currentexe_cold_3();
LAB_0015b305:
    pcStack_420 = (char *)0x15b30a;
    run_test_get_currentexe_cold_4();
LAB_0015b30a:
    pcStack_420 = (char *)0x15b30f;
    run_test_get_currentexe_cold_5();
LAB_0015b30f:
    pcStack_420 = (char *)0x15b314;
    run_test_get_currentexe_cold_6();
LAB_0015b314:
    pcStack_420 = (char *)0x15b319;
    run_test_get_currentexe_cold_7();
LAB_0015b319:
    pcStack_420 = (char *)0x15b31e;
    run_test_get_currentexe_cold_8();
LAB_0015b31e:
    pcStack_420 = (char *)0x15b323;
    run_test_get_currentexe_cold_9();
LAB_0015b323:
    pcStack_420 = (char *)0x15b328;
    run_test_get_currentexe_cold_10();
LAB_0015b328:
    pcStack_420 = (char *)0x15b32d;
    run_test_get_currentexe_cold_12();
  }
  pcStack_420 = (char *)0x15b332;
  run_test_get_currentexe_cold_11();
  dStack_440 = -1.0;
  dStack_438 = -1.0;
  dStack_430 = -1.0;
  pcStack_420 = unaff_RBX;
  uv_loadavg(&dStack_440);
  if (dStack_440 < 0.0) {
    run_test_get_loadavg_cold_3();
LAB_0015b395:
    run_test_get_loadavg_cold_2();
  }
  else {
    if (dStack_438 < 0.0) goto LAB_0015b395;
    if (0.0 <= dStack_430) {
      return 0;
    }
  }
  run_test_get_loadavg_cold_1();
  ppcStack_460 = (char **)0x15b3a9;
  puStack_450 = (undefined1 *)&dStack_440;
  ppcVar3 = (char **)uv_get_free_memory();
  ppcStack_460 = (char **)0x15b3b1;
  ppcVar4 = (char **)uv_get_total_memory();
  ppcStack_460 = (char **)0x15b3b9;
  uVar5 = uv_get_constrained_memory();
  ppcStack_460 = (char **)0x15b3d0;
  printf("free_mem=%llu, total_mem=%llu, constrained_mem=%llu\n",ppcVar3,ppcVar4,uVar5);
  if (ppcVar3 == (char **)0x0) {
    ppcStack_460 = (char **)0x15b3ee;
    run_test_get_memory_cold_3();
LAB_0015b3ee:
    ppcStack_460 = (char **)0x15b3f3;
    run_test_get_memory_cold_2();
  }
  else {
    if (ppcVar4 == (char **)0x0) goto LAB_0015b3ee;
    if (ppcVar3 < ppcVar4) {
      return 0;
    }
  }
  ppcStack_460 = (char **)run_test_get_passwd;
  run_test_get_memory_cold_1();
  ppcStack_498 = (char **)0x15b407;
  ppcStack_460 = ppcVar3;
  iVar1 = uv_os_get_passwd(&pcStack_488);
  ppcVar4 = ppcStack_468;
  if (iVar1 == 0) {
    if (*pcStack_488 == '\0') goto LAB_0015b4cb;
    if (*pcStack_470 == '\0') goto LAB_0015b4d0;
    ppcStack_498 = (char **)0x15b438;
    sVar6 = strlen((char *)ppcStack_468);
    ppcVar3 = ppcVar4;
    if (sVar6 != 1) {
      if (sVar6 != 0) {
        if (*(char *)((long)ppcVar4 + (sVar6 - 1)) == '/') {
          ppcStack_498 = (char **)0x15b453;
          run_test_get_passwd_cold_13();
          goto LAB_0015b453;
        }
        goto LAB_0015b45c;
      }
      goto LAB_0015b502;
    }
LAB_0015b453:
    if (*(char *)ppcVar4 == '/') {
LAB_0015b45c:
      if (lStack_480 < 0) goto LAB_0015b4d5;
      if (lStack_478 < 0) goto LAB_0015b4da;
      ppcVar3 = &pcStack_488;
      ppcStack_498 = (char **)0x15b479;
      uv_os_free_passwd(ppcVar3);
      if (pcStack_488 != (char *)0x0) goto LAB_0015b4df;
      if (pcStack_470 != (char *)0x0) goto LAB_0015b4e4;
      if (ppcStack_468 != (char **)0x0) goto LAB_0015b4e9;
      ppcVar3 = &pcStack_488;
      ppcStack_498 = (char **)0x15b49c;
      uv_os_free_passwd(ppcVar3);
      if (pcStack_488 != (char *)0x0) goto LAB_0015b4ee;
      if (pcStack_470 != (char *)0x0) goto LAB_0015b4f3;
      if (ppcStack_468 != (char **)0x0) goto LAB_0015b4f8;
      ppcStack_498 = (char **)0x15b4b9;
      iVar1 = uv_os_get_passwd(0);
      if (iVar1 == -0x16) {
        return 0;
      }
      goto LAB_0015b4fd;
    }
  }
  else {
    ppcStack_498 = (char **)0x15b4cb;
    run_test_get_passwd_cold_1();
LAB_0015b4cb:
    ppcStack_498 = (char **)0x15b4d0;
    run_test_get_passwd_cold_15();
LAB_0015b4d0:
    ppcStack_498 = (char **)0x15b4d5;
    run_test_get_passwd_cold_14();
LAB_0015b4d5:
    ppcStack_498 = (char **)0x15b4da;
    run_test_get_passwd_cold_4();
LAB_0015b4da:
    ppcStack_498 = (char **)0x15b4df;
    run_test_get_passwd_cold_5();
LAB_0015b4df:
    ppcStack_498 = (char **)0x15b4e4;
    run_test_get_passwd_cold_6();
LAB_0015b4e4:
    ppcStack_498 = (char **)0x15b4e9;
    run_test_get_passwd_cold_7();
LAB_0015b4e9:
    ppcStack_498 = (char **)0x15b4ee;
    run_test_get_passwd_cold_8();
LAB_0015b4ee:
    ppcStack_498 = (char **)0x15b4f3;
    run_test_get_passwd_cold_9();
LAB_0015b4f3:
    ppcStack_498 = (char **)0x15b4f8;
    run_test_get_passwd_cold_10();
LAB_0015b4f8:
    ppcStack_498 = (char **)0x15b4fd;
    run_test_get_passwd_cold_11();
LAB_0015b4fd:
    ppcStack_498 = (char **)0x15b502;
    run_test_get_passwd_cold_12();
LAB_0015b502:
    ppcStack_498 = (char **)0x15b507;
    run_test_get_passwd_cold_3();
  }
  ppcStack_498 = (char **)run_test_getaddrinfo_fail;
  run_test_get_passwd_cold_2();
  iVar1 = (int)auStack_538;
  pcStack_540 = (code *)0x15b519;
  ppcStack_498 = ppcVar3;
  uVar5 = uv_default_loop();
  pcStack_540 = (code *)0x15b533;
  iVar2 = uv_getaddrinfo(uVar5,auStack_538,abort,0,0,0);
  if (iVar2 == -0x16) {
    pcStack_540 = (code *)0x15b541;
    uVar5 = uv_default_loop();
    pcStack_540 = (code *)0x15b560;
    iVar1 = (int)auStack_538;
    iVar2 = uv_getaddrinfo(uVar5,auStack_538,getaddrinfo_fail_cb,"xyzzy.xyzzy.xyzzy.",0,0);
    if (iVar2 != 0) goto LAB_0015b5c4;
    pcStack_540 = (code *)0x15b569;
    uVar5 = uv_default_loop();
    iVar1 = 0;
    pcStack_540 = (code *)0x15b573;
    iVar2 = uv_run(uVar5);
    if (iVar2 != 0) goto LAB_0015b5c9;
    if (fail_cb_called != 1) goto LAB_0015b5ce;
    pcStack_540 = (code *)0x15b585;
    ppcVar3 = (char **)uv_default_loop();
    pcStack_540 = (code *)0x15b599;
    uv_walk(ppcVar3,close_walk_cb,0);
    iVar1 = 0;
    pcStack_540 = (code *)0x15b5a3;
    uv_run(ppcVar3);
    pcStack_540 = (code *)0x15b5a8;
    uVar5 = uv_default_loop();
    pcStack_540 = (code *)0x15b5b0;
    iVar2 = uv_loop_close(uVar5);
    if (iVar2 == 0) {
      return 0;
    }
  }
  else {
    pcStack_540 = (code *)0x15b5c4;
    run_test_getaddrinfo_fail_cold_1();
LAB_0015b5c4:
    pcStack_540 = (code *)0x15b5c9;
    run_test_getaddrinfo_fail_cold_2();
LAB_0015b5c9:
    pcStack_540 = (code *)0x15b5ce;
    run_test_getaddrinfo_fail_cold_3();
LAB_0015b5ce:
    pcStack_540 = (code *)0x15b5d3;
    run_test_getaddrinfo_fail_cold_4();
  }
  pcStack_540 = getaddrinfo_fail_cb;
  run_test_getaddrinfo_fail_cold_5();
  if (fail_cb_called == 0) {
    if (-1 < iVar1) goto LAB_0015b5ff;
    if (extraout_RDX == 0) {
      ppcStack_548 = (char **)0x15b5f2;
      pcStack_540._0_4_ = extraout_EAX;
      uv_freeaddrinfo(0);
      fail_cb_called = fail_cb_called + 1;
      return (int)pcStack_540;
    }
  }
  else {
    ppcStack_548 = (char **)0x15b5ff;
    getaddrinfo_fail_cb_cold_1();
LAB_0015b5ff:
    ppcStack_548 = (char **)0x15b604;
    getaddrinfo_fail_cb_cold_2();
  }
  ppcStack_548 = (char **)run_test_getaddrinfo_fail_sync;
  getaddrinfo_fail_cb_cold_3();
  ppcStack_5f0 = (char **)0x15b616;
  ppcStack_548 = ppcVar3;
  uVar5 = uv_default_loop();
  ppcStack_5f0 = (char **)0x15b630;
  iVar1 = uv_getaddrinfo(uVar5,auStack_5e8,0,"xyzzy.xyzzy.xyzzy.",0,0);
  if (iVar1 < 0) {
    ppcStack_5f0 = (char **)0x15b641;
    uv_freeaddrinfo(uStack_558);
    ppcStack_5f0 = (char **)0x15b646;
    ppcVar3 = (char **)uv_default_loop();
    ppcStack_5f0 = (char **)0x15b65a;
    uv_walk(ppcVar3,close_walk_cb,0);
    ppcStack_5f0 = (char **)0x15b664;
    uv_run(ppcVar3,0);
    ppcStack_5f0 = (char **)0x15b669;
    uVar5 = uv_default_loop();
    ppcStack_5f0 = (char **)0x15b671;
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    ppcStack_5f0 = (char **)0x15b685;
    run_test_getaddrinfo_fail_sync_cold_1();
  }
  ppcStack_5f0 = (char **)run_test_getaddrinfo_basic;
  run_test_getaddrinfo_fail_sync_cold_2();
  ppcStack_5f8 = (char **)0x15b695;
  ppcStack_5f0 = ppcVar3;
  getaddrinfo_handle = (uv_getaddrinfo_t *)malloc(0xa0);
  ppcStack_5f8 = (char **)0x15b6a1;
  puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
  ppcStack_5f8 = (char **)0x15b6c4;
  iVar1 = uv_getaddrinfo(puVar7,getaddrinfo_handle,getaddrinfo_basic_cb,"localhost",0,0);
  if (iVar1 == 0) {
    ppcStack_5f8 = (char **)0x15b6cd;
    puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_5f8 = (char **)0x15b6d7;
    uv_run(puVar7,0);
    if (getaddrinfo_cbs != 1) goto LAB_0015b71d;
    ppcStack_5f8 = (char **)0x15b6e5;
    ppcVar3 = (char **)uv_default_loop();
    ppcStack_5f8 = (char **)0x15b6f9;
    uv_walk(ppcVar3,close_walk_cb,0);
    ppcStack_5f8 = (char **)0x15b703;
    uv_run(ppcVar3,0);
    ppcStack_5f8 = (char **)0x15b708;
    puVar7 = (uv_getaddrinfo_t *)uv_default_loop();
    ppcStack_5f8 = (char **)0x15b710;
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    ppcStack_5f8 = (char **)0x15b71d;
    run_test_getaddrinfo_basic_cold_1();
LAB_0015b71d:
    ppcStack_5f8 = (char **)0x15b722;
    run_test_getaddrinfo_basic_cold_2();
  }
  ppcStack_5f8 = (char **)getaddrinfo_basic_cb;
  run_test_getaddrinfo_basic_cold_3();
  ppcStack_5f8 = ppcVar3;
  if (getaddrinfo_handle == puVar7) {
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    ppcStack_600 = (char **)0x15b73f;
    free(puVar7);
    iVar1 = uv_freeaddrinfo(extraout_RDX_00);
    return iVar1;
  }
  ppcStack_600 = (char **)run_test_getaddrinfo_basic_sync;
  getaddrinfo_basic_cb_cold_1();
  ppcStack_600 = ppcVar3;
  uVar5 = uv_default_loop();
  iVar1 = uv_getaddrinfo(uVar5,auStack_6a0,0,"localhost",0,0);
  if (iVar1 == 0) {
    uv_freeaddrinfo(uStack_610);
    ppcVar3 = (char **)uv_default_loop();
    uv_walk(ppcVar3,close_walk_cb,0);
    uv_run(ppcVar3,0);
    uVar5 = uv_default_loop();
    iVar1 = uv_loop_close(uVar5);
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_getaddrinfo_basic_sync_cold_1();
  }
  run_test_getaddrinfo_basic_sync_cold_2();
  puVar7 = getaddrinfo_handles;
  piVar13 = callback_counts;
  lVar14 = 0;
  do {
    *piVar13 = 0;
    puVar12 = (undefined8 *)0x4;
    puVar8 = (undefined4 *)malloc(4);
    if (puVar8 == (undefined4 *)0x0) {
      run_test_getaddrinfo_concurrent_cold_4();
LAB_0015b8bc:
      run_test_getaddrinfo_concurrent_cold_1();
      goto LAB_0015b8c1;
    }
    *puVar8 = (int)lVar14;
    puVar7->data = puVar8;
    puVar12 = (undefined8 *)uv_default_loop();
    iVar1 = uv_getaddrinfo(puVar12,puVar7,getaddrinfo_cuncurrent_cb,"localhost",0,0,ppcVar3);
    if (iVar1 != 0) goto LAB_0015b8bc;
    lVar14 = lVar14 + 1;
    puVar7 = puVar7 + 1;
    piVar13 = piVar13 + 1;
  } while (lVar14 != 10);
  puVar12 = (undefined8 *)uv_default_loop();
  lVar14 = 0;
  uv_run(puVar12,0);
  do {
    if (*(int *)((long)callback_counts + lVar14) != 1) goto LAB_0015b8c1;
    lVar14 = lVar14 + 4;
  } while (lVar14 != 0x28);
  uVar5 = uv_default_loop();
  uv_walk(uVar5,close_walk_cb,0);
  uv_run(uVar5,0);
  puVar12 = (undefined8 *)uv_default_loop();
  iVar1 = uv_loop_close();
  if (iVar1 == 0) {
    return 0;
  }
LAB_0015b8c6:
  run_test_getaddrinfo_concurrent_cold_3();
  piVar13 = (int *)*puVar12;
  piVar9 = callback_counts;
  psVar11 = &closedir_req.bufsml[1].len;
  lVar14 = 0;
  do {
    psVar11 = psVar11 + 0x14;
    if (psVar11 == puVar12) goto LAB_0015b903;
    piVar9 = piVar9 + 1;
    lVar14 = lVar14 + 1;
  } while (lVar14 != 10);
  getaddrinfo_cuncurrent_cb_cold_1();
  lVar14 = extraout_RDX_02;
LAB_0015b903:
  if (*piVar13 == (int)lVar14) {
    *piVar9 = *piVar9 + 1;
    free(piVar13);
    iVar1 = uv_freeaddrinfo(extraout_RDX_01);
    getaddrinfo_cbs = getaddrinfo_cbs + 1;
    return iVar1;
  }
  getaddrinfo_cuncurrent_cb_cold_2();
  iVar1 = uv_is_closing();
  if (iVar1 != 0) {
    return iVar1;
  }
  iVar1 = uv_close(piVar13,0);
  return iVar1;
LAB_0015b8c1:
  run_test_getaddrinfo_concurrent_cold_2();
  goto LAB_0015b8c6;
}

Assistant:

TEST_IMPL(get_currentexe) {
  char buffer[PATHMAX];
  size_t size;
  char* match;
  char* path;
  int r;

  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(buffer, &size);
  ASSERT(!r);

  /* uv_exepath can return an absolute path on darwin, so if the test runner
   * was run with a relative prefix of "./", we need to strip that prefix off
   * executable_path or we'll fail. */
  if (executable_path[0] == '.' && executable_path[1] == '/') {
    path = executable_path + 2;
  } else {
    path = executable_path;
  }

  match = strstr(buffer, path);
  /* Verify that the path returned from uv_exepath is a subdirectory of
   * executable_path.
   */
  ASSERT(match && !strcmp(match, path));
  ASSERT(size == strlen(buffer));

  /* Negative tests */
  size = sizeof(buffer) / sizeof(buffer[0]);
  r = uv_exepath(NULL, &size);
  ASSERT(r == UV_EINVAL);

  r = uv_exepath(buffer, NULL);
  ASSERT(r == UV_EINVAL);

  size = 0;
  r = uv_exepath(buffer, &size);
  ASSERT(r == UV_EINVAL);

  memset(buffer, -1, sizeof(buffer));

  size = 1;
  r = uv_exepath(buffer, &size);
  ASSERT(r == 0);
  ASSERT(size == 0);
  ASSERT(buffer[0] == '\0');

  memset(buffer, -1, sizeof(buffer));

  size = 2;
  r = uv_exepath(buffer, &size);
  ASSERT(r == 0);
  ASSERT(size == 1);
  ASSERT(buffer[0] != '\0');
  ASSERT(buffer[1] == '\0');

  return 0;
}